

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O3

void av1_apply_temporal_filter_c
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint8_t *puVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  void *__s;
  void *__s_00;
  ulong uVar11;
  uint uVar12;
  byte bVar13;
  ushort uVar14;
  int iVar15;
  undefined7 in_register_00000011;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ushort uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  int ww;
  int iVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  double decay_factor [3];
  double d_factor [4];
  ulong local_168;
  uint local_130;
  double local_78 [4];
  double local_58 [5];
  
  uVar30 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar2 = block_size_high[uVar30];
  iVar9 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar23 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar23 < iVar9) {
    iVar9 = iVar23;
  }
  bVar3 = block_size_wide[uVar30];
  uVar4 = frame_to_filter->flags;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  if (q_factor < 0x80) {
    dVar36 = (double)q_factor / 20.0;
    dVar36 = dVar36 * dVar36;
    dVar32 = 1.0;
    if (dVar36 <= 1.0) {
      dVar32 = dVar36;
    }
    dVar32 = (double)(-(ulong)(dVar36 < 1e-05) & 0x3ee4f8b588e368f1 |
                     ~-(ulong)(dVar36 < 1e-05) & (ulong)dVar32);
  }
  else {
    dVar32 = (double)q_factor * 0.015625;
    dVar32 = dVar32 * dVar32 * 0.5;
  }
  if (0 < num_planes) {
    dVar37 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
    dVar36 = 1.0;
    if (dVar37 <= 1.0) {
      dVar36 = dVar37;
    }
    uVar30 = 0;
    do {
      dVar31 = log(noise_levels[uVar30] + noise_levels[uVar30] + 5.0);
      local_78[uVar30] =
           1.0 / ((dVar31 + 0.5) * dVar32 *
                 (double)(-(ulong)(dVar37 < 1e-05) & 0x3ee4f8b588e368f1 |
                         ~-(ulong)(dVar37 < 1e-05) & (ulong)dVar36));
      uVar30 = uVar30 + 1;
    } while ((uint)num_planes != uVar30);
  }
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  dVar32 = (double)iVar9 * 0.1;
  if (dVar32 <= 1.0) {
    dVar32 = 1.0;
  }
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  auVar33._8_8_ = dVar32;
  auVar33._0_8_ = dVar32;
  lVar10 = 0;
  do {
    uVar1 = *(undefined8 *)(subblock_mvs + lVar10);
    dVar37 = (double)(int)(short)((ulong)uVar1 >> 0x20);
    dVar32 = (double)((int)uVar1 >> 0x10);
    dVar36 = (double)(int)((long)uVar1 >> 0x30);
    auVar35._0_8_ = dVar32 * dVar32 + (double)(int)(short)uVar1 * (double)(int)(short)uVar1;
    auVar35._8_8_ = dVar36 * dVar36 + dVar37 * dVar37;
    auVar35 = sqrtpd(auVar35,auVar35);
    auVar35 = divpd(auVar35,auVar33);
    auVar35 = maxpd(auVar35,_DAT_004d3f10);
    *(undefined1 (*) [16])(local_58 + lVar10) = auVar35;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 4);
  uVar30 = (ulong)((uint)bVar2 * (uint)bVar3 * 4);
  __s = aom_memalign(0x10,uVar30);
  if (__s == (void *)0x0) {
    aom_internal_error(mbd->error_info,AOM_CODEC_MEM_ERROR,"Error allocating temporal filter data");
  }
  memset(__s,0,uVar30);
  __s_00 = aom_memalign(0x20,uVar30);
  if (__s_00 == (void *)0x0) {
    aom_free(__s);
    aom_internal_error(mbd->error_info,AOM_CODEC_MEM_ERROR,"Error allocating temporal filter data");
  }
  memset(__s_00,0,uVar30);
  if (0 < num_planes) {
    uVar30 = 0;
    local_130 = 0;
    do {
      iVar9 = mbd->plane[uVar30].subsampling_x;
      iVar23 = mbd->plane[uVar30].subsampling_y;
      bVar8 = bVar2 >> ((byte)iVar23 & 0x1f);
      uVar18 = (uint)bVar8;
      bVar6 = (byte)iVar9 & 0x1f;
      uVar17 = (uint)(bVar3 >> bVar6);
      iVar23 = iVar23 - mbd->plane[0].subsampling_y;
      iVar9 = iVar9 - mbd->plane[0].subsampling_x;
      bVar13 = (byte)iVar9;
      bVar7 = (byte)iVar23;
      dVar32 = 0.04;
      if (uVar30 != 0) {
        dVar32 = 1.0 / (double)((1 << (bVar13 + bVar7 & 0x1f)) + 0x19);
      }
      iVar19 = *(int *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar30 != 0) * 4 + -0x28);
      puVar5 = frame_to_filter->store_buf_adr[uVar30 - 4];
      if (uVar30 == 1) {
        if (uVar18 != 0) {
          uVar24 = 1 << (bVar7 & 0x1f);
          uVar27 = 1 << (bVar13 & 0x1f);
          iVar26 = uVar17 << (bVar13 & 0x1f);
          if ((int)uVar27 < 2) {
            uVar27 = 1;
          }
          if ((int)uVar24 < 2) {
            uVar24 = 1;
          }
          local_168 = 0;
          do {
            if (bVar3 >> bVar6 != 0) {
              lVar10 = local_168 * uVar17;
              uVar20 = 0;
              do {
                if (iVar23 != 0x1f) {
                  iVar16 = ((int)uVar20 << (bVar13 & 0x1f)) +
                           ((int)local_168 << (bVar7 & 0x1f)) * iVar26;
                  uVar12 = 0;
                  do {
                    if (iVar9 != 0x1f) {
                      iVar28 = *(int *)((long)__s_00 + uVar20 * 4 + lVar10 * 4);
                      uVar25 = (ulong)uVar27;
                      iVar15 = iVar16;
                      do {
                        iVar28 = iVar28 + *(int *)((long)__s + (long)iVar15 * 4);
                        *(int *)((long)__s_00 + uVar20 * 4 + lVar10 * 4) = iVar28;
                        iVar15 = iVar15 + 1;
                        uVar25 = uVar25 - 1;
                      } while (uVar25 != 0);
                    }
                    uVar12 = uVar12 + 1;
                    iVar16 = iVar16 + iVar26;
                  } while (uVar12 != uVar24);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar17);
            }
            local_168 = local_168 + 1;
          } while (local_168 != uVar18);
          goto LAB_0022d44a;
        }
      }
      else {
LAB_0022d44a:
        if (uVar18 != 0) {
          lVar10 = (long)(int)(uVar17 * mb_col + uVar18 * mb_row * iVar19);
          uVar20 = (ulong)local_130;
          iVar26 = 0;
          iVar9 = 0;
          iVar23 = 0;
          uVar27 = 0;
          do {
            if (bVar3 >> bVar6 != 0) {
              lVar21 = 0;
              do {
                if ((uVar4 & 8) == 0) {
                  uVar14 = (ushort)puVar5[lVar21 + iVar26 + lVar10];
                  uVar22 = (ushort)pred[lVar21 + (long)iVar9 + uVar20];
                }
                else {
                  uVar14 = *(ushort *)
                            (lVar10 * 2 + (long)puVar5 * 2 + (long)iVar26 * 2 + lVar21 * 2);
                  uVar22 = *(ushort *)((long)pred * 2 + uVar20 * 2 + (long)iVar9 * 2 + lVar21 * 2);
                }
                iVar16 = (uint)uVar22 - (uint)uVar14;
                if (uVar22 < uVar14) {
                  iVar16 = (uint)uVar14 - (uint)uVar22;
                }
                *(int *)((long)__s + lVar21 * 4 + (long)iVar23 * 4) = iVar16 * iVar16;
                lVar21 = lVar21 + 1;
                uVar24 = (uint)lVar21;
              } while (uVar17 != uVar24);
              iVar23 = iVar23 + uVar24;
              iVar9 = iVar9 + uVar24;
              iVar26 = iVar26 + uVar24;
            }
            iVar26 = iVar26 + (iVar19 - uVar17);
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar18);
          uVar25 = 0;
          lVar10 = 0;
          do {
            if (bVar3 >> bVar6 != 0) {
              dVar36 = local_78[uVar30];
              lVar10 = (long)(int)lVar10;
              uVar29 = 0;
              do {
                iVar9 = -2;
                lVar21 = 0;
                do {
                  iVar19 = iVar9 + (int)uVar25;
                  iVar23 = uVar18 - 1;
                  if (iVar19 < (int)uVar18) {
                    iVar23 = iVar19;
                  }
                  if (iVar19 < 0) {
                    iVar23 = 0;
                  }
                  iVar19 = -2;
                  do {
                    iVar16 = (int)uVar29 + iVar19;
                    iVar26 = uVar17 - 1;
                    if (iVar16 < (int)uVar17) {
                      iVar26 = iVar16;
                    }
                    if (iVar16 < 0) {
                      iVar26 = 0;
                    }
                    lVar21 = lVar21 + (ulong)*(uint *)((long)__s +
                                                      (long)(int)(iVar26 + iVar23 * uVar17) * 4);
                    iVar19 = iVar19 + 1;
                  } while (iVar19 != 3);
                  iVar9 = iVar9 + 1;
                } while (iVar9 != 3);
                bVar13 = (char)mbd->bd * '\x02' - 0x10;
                if (mbd->bd < 9) {
                  bVar13 = 0;
                }
                uVar11 = lVar21 + (ulong)*(uint *)((long)__s_00 + uVar29 * 4 + uVar25 * uVar17 * 4)
                         >> (bVar13 & 0x3f);
                uVar27 = (uint)((byte)((bVar3 >> bVar6) >> 1) <= uVar29) |
                         (uint)(bVar8 >> 1 <= uVar25) * 2;
                auVar34._8_4_ = (int)(uVar11 >> 0x20);
                auVar34._0_8_ = uVar11;
                auVar34._12_4_ = 0x45300000;
                dVar37 = (((auVar34._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) * dVar32
                          * 0.041666666666666664 +
                         (double)subblock_mses[uVar27] * 0.008333333333333333) * local_58[uVar27] *
                         dVar36;
                if (7.0 <= dVar37) {
                  dVar37 = 7.0;
                }
                if (tf_wgt_calc_lvl == 0) {
                  dVar37 = exp(-dVar37);
                  iVar9 = (int)(dVar37 * 1000.0);
                }
                else {
                  iVar9 = (int)((float)((int)((float)dVar37 * -12102203.0) + 0x3f7f127f) * 1000.0 +
                               0.5);
                }
                lVar21 = uVar20 + lVar10;
                if ((uVar4 & 8) == 0) {
                  uVar27 = (uint)pred[lVar21];
                }
                else {
                  uVar27 = (uint)*(ushort *)((long)pred * 2 + lVar21 * 2);
                }
                accum[lVar21] = accum[lVar21] + uVar27 * iVar9;
                count[lVar21] = count[lVar21] + (short)iVar9;
                lVar10 = lVar10 + 1;
                uVar29 = uVar29 + 1;
              } while (uVar29 != uVar17);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar18);
        }
      }
      local_130 = local_130 + uVar17 * uVar18;
      uVar30 = uVar30 + 1;
    } while (uVar30 != (uint)num_planes);
  }
  aom_free(__s);
  aom_free(__s_00);
  return;
}

Assistant:

void av1_apply_temporal_filter_c(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  // Block information.
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int mb_pels = mb_height * mb_width;
  const int is_high_bitdepth = is_frame_high_bitdepth(frame_to_filter);
  const uint16_t *pred16 = CONVERT_TO_SHORTPTR(pred);
  // Frame information.
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Decay factors for non-local mean approach.
  double decay_factor[MAX_MB_PLANE] = { 0 };
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  for (int plane = 0; plane < num_planes; plane++) {
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    decay_factor[plane] = 1 / (n_decay * q_decay * s_decay);
  }
  double d_factor[4] = { 0 };
  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Allocate memory for pixel-wise squared differences. They,
  // regardless of the subsampling, are assigned with memory of size `mb_pels`.
  uint32_t *square_diff = aom_memalign(16, mb_pels * sizeof(uint32_t));
  if (!square_diff) {
    aom_internal_error(mbd->error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(square_diff, 0, mb_pels * sizeof(square_diff[0]));

  // Allocate memory for accumulated luma squared error. This value will be
  // consumed while filtering the chroma planes.
  uint32_t *luma_sse_sum = aom_memalign(32, mb_pels * sizeof(uint32_t));
  if (!luma_sse_sum) {
    aom_free(square_diff);
    aom_internal_error(mbd->error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(luma_sse_sum, 0, mb_pels * sizeof(luma_sse_sum[0]));

  // Get window size for pixel-wise filtering.
  assert(TF_WINDOW_LENGTH % 2 == 1);
  const int half_window = TF_WINDOW_LENGTH >> 1;

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    // Locate pixel on reference frame.
    const int subsampling_y = mbd->plane[plane].subsampling_y;
    const int subsampling_x = mbd->plane[plane].subsampling_x;
    const int h = mb_height >> subsampling_y;  // Plane height.
    const int w = mb_width >> subsampling_x;   // Plane width.
    const int frame_stride =
        frame_to_filter->strides[plane == AOM_PLANE_Y ? 0 : 1];
    const int frame_offset = mb_row * h * frame_stride + mb_col * w;
    const uint8_t *ref = frame_to_filter->buffers[plane];
    const int ss_y_shift =
        subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int ss_x_shift =
        subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane will
    // be more accurate. The luma sse sum is reused in both chroma planes.
    if (plane == AOM_PLANE_U)
      compute_luma_sq_error_sum(square_diff, luma_sse_sum, h, w, ss_x_shift,
                                ss_y_shift);
    compute_square_diff(ref, frame_offset, frame_stride, pred, plane_offset, w,
                        h, w, is_high_bitdepth, square_diff);

    // Perform filtering.
    int pred_idx = 0;
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        // non-local mean approach
        uint64_t sum_square_diff = 0;

        for (int wi = -half_window; wi <= half_window; ++wi) {
          for (int wj = -half_window; wj <= half_window; ++wj) {
            const int y = CLIP(i + wi, 0, h - 1);  // Y-coord on current plane.
            const int x = CLIP(j + wj, 0, w - 1);  // X-coord on current plane.
            sum_square_diff += square_diff[y * w + x];
          }
        }

        sum_square_diff += luma_sse_sum[i * w + j];

        // Scale down the difference for high bit depth input.
        if (mbd->bd > 8) sum_square_diff >>= ((mbd->bd - 8) * 2);

        // Combine window error and block error, and normalize it.
        const double window_error = sum_square_diff * inv_num_ref_pixels;
        const int subblock_idx = (i >= h / 2) * 2 + (j >= w / 2);
        const double block_error = (double)subblock_mses[subblock_idx];
        const double combined_error =
            weight_factor * window_error + block_error * inv_factor;

        // Compute filter weight.
        double scaled_error =
            combined_error * d_factor[subblock_idx] * decay_factor[plane];
        scaled_error = AOMMIN(scaled_error, 7);
        int weight;
        if (tf_wgt_calc_lvl == 0) {
          weight = (int)(exp(-scaled_error) * TF_WEIGHT_SCALE);
        } else {
          const float fweight =
              approx_exp((float)-scaled_error) * TF_WEIGHT_SCALE;
          weight = iroundpf(fweight);
        }

        const int idx = plane_offset + pred_idx;  // Index with plane shift.
        const int pred_value = is_high_bitdepth ? pred16[idx] : pred[idx];
        accum[idx] += weight * pred_value;
        count[idx] += weight;

        ++pred_idx;
      }
    }
    plane_offset += h * w;
  }

  aom_free(square_diff);
  aom_free(luma_sse_sum);
}